

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesBufferMemoryAliasing.cpp
# Opt level: O0

void __thiscall
vkt::sparse::anon_unknown_0::BufferSparseMemoryAliasingCase::initPrograms
          (BufferSparseMemoryAliasingCase *this,SourceCollections *sourceCollections)

{
  uint uVar1;
  ostream *poVar2;
  ProgramSources *this_00;
  string local_228;
  ShaderSource local_208;
  allocator<char> local_1d9;
  string local_1d8;
  ostringstream local_1a8 [8];
  ostringstream src;
  undefined1 local_30 [8];
  UVec3 workGroupSize;
  deUint32 numInvocations;
  char *versionDecl;
  SourceCollections *sourceCollections_local;
  BufferSparseMemoryAliasingCase *this_local;
  
  register0x00000000 = glu::getGLSLVersionDeclaration(this->m_glslVersion);
  workGroupSize.m_data[1] = this->m_bufferSizeInBytes >> 2;
  computeWorkGroupSize((anon_unknown_0 *)local_30,workGroupSize.m_data[1]);
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  poVar2 = std::operator<<((ostream *)local_1a8,stack0xffffffffffffffe0);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"layout (local_size_x = ");
  uVar1 = tcu::Vector<unsigned_int,_3>::x((Vector<unsigned_int,_3> *)local_30);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,uVar1);
  poVar2 = std::operator<<(poVar2,", local_size_y = ");
  uVar1 = tcu::Vector<unsigned_int,_3>::y((Vector<unsigned_int,_3> *)local_30);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,uVar1);
  poVar2 = std::operator<<(poVar2,", local_size_z = ");
  uVar1 = tcu::Vector<unsigned_int,_3>::z((Vector<unsigned_int,_3> *)local_30);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,uVar1);
  poVar2 = std::operator<<(poVar2,") in;\n");
  poVar2 = std::operator<<(poVar2,"layout(set = 0, binding = 0, std430) writeonly buffer Output\n");
  poVar2 = std::operator<<(poVar2,"{\n");
  poVar2 = std::operator<<(poVar2,"\tuint result[];\n");
  poVar2 = std::operator<<(poVar2,"} sb_out;\n");
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"void main (void)\n");
  poVar2 = std::operator<<(poVar2,"{\n");
  poVar2 = std::operator<<(poVar2,
                           "\tuint index = gl_GlobalInvocationID.x + (gl_GlobalInvocationID.y + gl_GlobalInvocationID.z*gl_NumWorkGroups.y*gl_WorkGroupSize.y)*gl_NumWorkGroups.x*gl_WorkGroupSize.x;\n"
                          );
  poVar2 = std::operator<<(poVar2,"\tif ( index < ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->m_bufferSizeInBytes >> 2);
  poVar2 = std::operator<<(poVar2,"u )\n");
  poVar2 = std::operator<<(poVar2,"\t{\n");
  poVar2 = std::operator<<(poVar2,"\t\tsb_out.result[index] = index % ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x400);
  poVar2 = std::operator<<(poVar2,"u;\n");
  poVar2 = std::operator<<(poVar2,"\t}\n");
  std::operator<<(poVar2,"}\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,"comp",&local_1d9);
  this_00 = ::vk::ProgramCollection<glu::ProgramSources>::add
                      (&sourceCollections->glslSources,&local_1d8);
  std::__cxx11::ostringstream::str();
  glu::ComputeSource::ComputeSource((ComputeSource *)&local_208,&local_228);
  glu::ProgramSources::operator<<(this_00,&local_208);
  glu::ComputeSource::~ComputeSource((ComputeSource *)&local_208);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::allocator<char>::~allocator(&local_1d9);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return;
}

Assistant:

void BufferSparseMemoryAliasingCase::initPrograms (SourceCollections& sourceCollections) const
{
	// Create compute program
	const char* const versionDecl		= glu::getGLSLVersionDeclaration(m_glslVersion);
	const deUint32	  numInvocations	= m_bufferSizeInBytes / SIZE_OF_UINT_IN_SHADER;
	const tcu::UVec3  workGroupSize		= computeWorkGroupSize(numInvocations);

	std::ostringstream src;
	src << versionDecl << "\n"
		<< "layout (local_size_x = " << workGroupSize.x() << ", local_size_y = " << workGroupSize.y() << ", local_size_z = " << workGroupSize.z() << ") in;\n"
		<< "layout(set = 0, binding = 0, std430) writeonly buffer Output\n"
		<< "{\n"
		<< "	uint result[];\n"
		<< "} sb_out;\n"
		<< "\n"
		<< "void main (void)\n"
		<< "{\n"
		<< "	uint index = gl_GlobalInvocationID.x + (gl_GlobalInvocationID.y + gl_GlobalInvocationID.z*gl_NumWorkGroups.y*gl_WorkGroupSize.y)*gl_NumWorkGroups.x*gl_WorkGroupSize.x;\n"
		<< "	if ( index < " << m_bufferSizeInBytes / SIZE_OF_UINT_IN_SHADER << "u )\n"
		<< "	{\n"
		<< "		sb_out.result[index] = index % " << MODULO_DIVISOR << "u;\n"
		<< "	}\n"
		<< "}\n";

	sourceCollections.glslSources.add("comp") << glu::ComputeSource(src.str());
}